

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderBindingTableBase.hpp
# Opt level: O2

void __thiscall
Diligent::ShaderBindingTableBase<Diligent::EngineVkImplTraits>::BindHitGroupForInstance
          (ShaderBindingTableBase<Diligent::EngineVkImplTraits> *this,ITopLevelAS *pTLAS,
          char *pInstanceName,Uint32 RayOffsetInHitGroupIndex,char *pShaderGroupName,void *pData,
          Uint32 DataSize)

{
  HIT_GROUP_BINDING_MODE HVar1;
  ShaderBindingTableBase<Diligent::EngineVkImplTraits> *pSVar2;
  uint uVar3;
  RenderDeviceVkImpl *pRVar4;
  bool bVar5;
  undefined4 in_register_0000000c;
  char (*Args_1) [61];
  char (*Args_1_00) [115];
  ulong uVar6;
  char (*Args_1_01) [96];
  IBottomLevelAS *pIVar7;
  ulong uVar8;
  char (*DataSize_00) [96];
  long lVar9;
  ulong __new_size;
  TLASInstanceDesc TVar10;
  string local_88;
  ShaderBindingTableBase<Diligent::EngineVkImplTraits> *local_68;
  ulong local_60;
  uint local_58;
  Uint32 local_54;
  void *local_50;
  TopLevelASVkImpl *local_48;
  ulong local_40;
  char *local_38;
  
  bVar5 = (DataSize != 0) != (pData == (void *)0x0);
  Args_1 = (char (*) [61])
           CONCAT71((int7)(CONCAT44(in_register_0000000c,RayOffsetInHitGroupIndex) >> 8),bVar5);
  local_68 = this;
  local_50 = pData;
  local_38 = pShaderGroupName;
  if (!bVar5) {
    FormatString<char[26],char[38]>
              (&local_88,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"(pData == nullptr) == (DataSize == 0)",(char (*) [38])Args_1);
    Args_1 = (char (*) [61])0xf6;
    DebugAssertionFailed
              ((Char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_),
               "BindHitGroupForInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
               ,0xf6);
    std::__cxx11::string::~string((string *)&local_88);
  }
  if ((local_50 != (void *)0x0) && (local_68->m_ShaderRecordSize != DataSize)) {
    FormatString<char[26],char[61]>
              (&local_88,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"(pData == nullptr) || (DataSize == this->m_ShaderRecordSize)",Args_1)
    ;
    Args_1 = (char (*) [61])0xf7;
    DebugAssertionFailed
              ((Char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_),
               "BindHitGroupForInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
               ,0xf7);
    std::__cxx11::string::~string((string *)&local_88);
  }
  if (pTLAS == (ITopLevelAS *)0x0) {
    FormatString<char[26],char[17]>
              (&local_88,(Diligent *)"Debug expression failed:\n",(char (*) [26])"pTLAS != nullptr",
               (char (*) [17])Args_1);
    DebugAssertionFailed
              ((Char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_),
               "BindHitGroupForInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
               ,0xf8);
    std::__cxx11::string::~string((string *)&local_88);
  }
  local_48 = ClassPtrCast<Diligent::TopLevelASVkImpl,Diligent::ITopLevelAS>(pTLAS);
  local_60 = (ulong)(local_48->super_TopLevelASBase<Diligent::EngineVkImplTraits>).m_BuildInfo.
                    HitGroupStride;
  local_54 = (local_48->super_TopLevelASBase<Diligent::EngineVkImplTraits>).m_BuildInfo.
             FirstContributionToHitGroupIndex;
  HVar1 = (local_48->super_TopLevelASBase<Diligent::EngineVkImplTraits>).m_BuildInfo.BindingMode;
  uVar8 = (ulong)HVar1;
  local_58 = (local_48->super_TopLevelASBase<Diligent::EngineVkImplTraits>).m_BuildInfo.
             LastContributionToHitGroupIndex;
  Args_1_00 = (char (*) [115])(ulong)local_58;
  TVar10 = TopLevelASBase<Diligent::EngineVkImplTraits>::GetInstanceDesc
                     (&local_48->super_TopLevelASBase<Diligent::EngineVkImplTraits>,pInstanceName);
  pIVar7 = TVar10.pBLAS;
  if (HIT_GROUP_BINDING_MODE_PER_INSTANCE < HVar1) {
    FormatString<char[26],char[115]>
              (&local_88,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "Info.BindingMode == HIT_GROUP_BINDING_MODE_PER_GEOMETRY || Info.BindingMode == HIT_GROUP_BINDING_MODE_PER_INSTANCE"
               ,Args_1_00);
    Args_1_00 = (char (*) [115])0xff;
    DebugAssertionFailed
              ((Char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_),
               "BindHitGroupForInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
               ,0xff);
    std::__cxx11::string::~string((string *)&local_88);
  }
  if ((uint)local_60 <= RayOffsetInHitGroupIndex) {
    FormatString<char[26],char[47]>
              (&local_88,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"RayOffsetInHitGroupIndex < Info.HitGroupStride",
               (char (*) [47])Args_1_00);
    Args_1_00 = (char (*) [115])0x100;
    DebugAssertionFailed
              ((Char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_),
               "BindHitGroupForInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
               ,0x100);
    std::__cxx11::string::~string((string *)&local_88);
  }
  if (TVar10.ContributionToHitGroupIndex == 0xffffffff) {
    FormatString<char[26],char[50]>
              (&local_88,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Desc.ContributionToHitGroupIndex != INVALID_INDEX",
               (char (*) [50])Args_1_00);
    Args_1_00 = (char (*) [115])0x101;
    DebugAssertionFailed
              ((Char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_),
               "BindHitGroupForInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
               ,0x101);
    std::__cxx11::string::~string((string *)&local_88);
  }
  if (pIVar7 == (IBottomLevelAS *)0x0) {
    FormatString<char[26],char[22]>
              (&local_88,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Desc.pBLAS != nullptr",(char (*) [22])Args_1_00);
    DebugAssertionFailed
              ((Char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_),
               "BindHitGroupForInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
               ,0x102);
    std::__cxx11::string::~string((string *)&local_88);
  }
  if (HVar1 != HIT_GROUP_BINDING_MODE_PER_INSTANCE) {
    if (HVar1 == HIT_GROUP_BINDING_MODE_PER_GEOMETRY) {
      uVar3 = (*(pIVar7->super_IDeviceObject).super_IObject._vptr_IObject[10])(pIVar7);
      uVar8 = (ulong)uVar3;
    }
    else {
      FormatString<char[21]>(&local_88,(char (*) [21])"unknown binding mode");
      DebugAssertionFailed
                ((Char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_),
                 "BindHitGroupForInstance",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
                 ,0x10c);
      std::__cxx11::string::~string((string *)&local_88);
      uVar8 = 0;
    }
  }
  pSVar2 = local_68;
  lVar9 = uVar8 * local_60;
  pRVar4 = DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
           ::GetDevice(&local_68->
                        super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
                      );
  DataSize_00 = (char (*) [96])(ulong)pSVar2->m_ShaderRecordStride;
  uVar6 = (long)(pSVar2->m_HitGroupsRecord).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pSVar2->m_HitGroupsRecord).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  __new_size = (lVar9 + (TVar10._0_8_ & 0xffffffff)) * (long)DataSize_00;
  if (__new_size < uVar6) {
    __new_size = uVar6;
  }
  local_40 = (ulong)(pRVar4->
                    super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                    ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.RayTracing.
                    ShaderGroupHandleSize;
  local_88._M_dataplus._M_p._0_1_ = 0xa7;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&pSVar2->m_HitGroupsRecord,__new_size,(value_type_conflict2 *)&local_88);
  pSVar2->m_Changed = true;
  uVar3 = RayOffsetInHitGroupIndex + TVar10.ContributionToHitGroupIndex;
  while (pSVar2 = local_68, bVar5 = uVar8 != 0, uVar8 = uVar8 - 1, bVar5) {
    lVar9 = (ulong)uVar3 * (long)DataSize_00;
    Args_1_01 = DataSize_00;
    PipelineStateBase<Diligent::EngineVkImplTraits>::CopyShaderHandle
              (&((local_68->m_pPSO).m_pObject)->
                super_PipelineStateBase<Diligent::EngineVkImplTraits>,local_38,
               (local_68->m_HitGroupsRecord).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + lVar9,(size_t)DataSize_00);
    memcpy((pSVar2->m_HitGroupsRecord).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + local_40 + lVar9,local_50,(ulong)DataSize);
    if ((uVar3 < local_54) || (local_58 < uVar3)) {
      FormatString<char[26],char[96]>
                (&local_88,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "Index >= Info.FirstContributionToHitGroupIndex && Index <= Info.LastContributionToHitGroupIndex"
                 ,Args_1_01);
      DebugAssertionFailed
                ((Char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_),
                 "BindHitGroupForInstance",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
                 ,0x121);
      std::__cxx11::string::~string((string *)&local_88);
    }
    OnBindHitGroup(local_68,local_48,(ulong)uVar3);
    uVar3 = uVar3 + (uint)local_60;
  }
  return;
}

Assistant:

BindHitGroupForInstance(ITopLevelAS* pTLAS,
                                                    const char*  pInstanceName,
                                                    Uint32       RayOffsetInHitGroupIndex,
                                                    const char*  pShaderGroupName,
                                                    const void*  pData,
                                                    Uint32       DataSize) override final
    {
        VERIFY_EXPR((pData == nullptr) == (DataSize == 0));
        VERIFY_EXPR((pData == nullptr) || (DataSize == this->m_ShaderRecordSize));
        VERIFY_EXPR(pTLAS != nullptr);

        TopLevelASImplType* const pTLASImpl = ClassPtrCast<TopLevelASImplType>(pTLAS);
        const TLASBuildInfo       Info      = pTLASImpl->GetBuildInfo();
        const TLASInstanceDesc    Desc      = pTLASImpl->GetInstanceDesc(pInstanceName);

        VERIFY_EXPR(Info.BindingMode == HIT_GROUP_BINDING_MODE_PER_GEOMETRY ||
                    Info.BindingMode == HIT_GROUP_BINDING_MODE_PER_INSTANCE);
        VERIFY_EXPR(RayOffsetInHitGroupIndex < Info.HitGroupStride);
        VERIFY_EXPR(Desc.ContributionToHitGroupIndex != INVALID_INDEX);
        VERIFY_EXPR(Desc.pBLAS != nullptr);

        const Uint32 InstanceOffset = Desc.ContributionToHitGroupIndex;
        Uint32       GeometryCount  = 0;

        switch (Info.BindingMode)
        {
            // clang-format off
            case HIT_GROUP_BINDING_MODE_PER_GEOMETRY:     GeometryCount = Desc.pBLAS->GetActualGeometryCount(); break;
            case HIT_GROUP_BINDING_MODE_PER_INSTANCE:     GeometryCount = 1;                                    break;
            default:                                      UNEXPECTED("unknown binding mode");
                // clang-format on
        }

        const Uint32 BeginIndex = InstanceOffset;
        const size_t EndIndex   = InstanceOffset + size_t{GeometryCount} * size_t{Info.HitGroupStride};
        const Uint32 GroupSize  = this->GetDevice()->GetAdapterInfo().RayTracing.ShaderGroupHandleSize;
        const size_t Stride     = this->m_ShaderRecordStride;

        this->m_HitGroupsRecord.resize(std::max(this->m_HitGroupsRecord.size(), EndIndex * Stride), Uint8{EmptyElem});
        this->m_Changed = true;

        for (Uint32 i = 0; i < GeometryCount; ++i)
        {
            Uint32 Index  = BeginIndex + i * Info.HitGroupStride + RayOffsetInHitGroupIndex;
            size_t Offset = Index * Stride;
            this->m_pPSO->CopyShaderHandle(pShaderGroupName, this->m_HitGroupsRecord.data() + Offset, Stride);

            std::memcpy(this->m_HitGroupsRecord.data() + Offset + GroupSize, pData, DataSize);

#ifdef DILIGENT_DEVELOPMENT
            VERIFY_EXPR(Index >= Info.FirstContributionToHitGroupIndex && Index <= Info.LastContributionToHitGroupIndex);
            OnBindHitGroup(pTLASImpl, Index);
#endif
        }
    }